

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectrum.cpp
# Opt level: O3

string * __thiscall
pbrt::RGBIlluminantSpectrum::ToString_abi_cxx11_
          (string *__return_storage_ptr__,RGBIlluminantSpectrum *this)

{
  DenselySampledSpectrum *args_1;
  
  args_1 = this->illuminant;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  detail::
  stringPrintfRecursive<pbrt::RGBSigmoidPolynomial_const&,float_const&,pbrt::DenselySampledSpectrum_const&>
            (__return_storage_ptr__,"[ RGBIlluminantSpectrum: rsp: %s scale: %f illuminant: %s ]",
             &this->rsp,&this->scale,args_1);
  return __return_storage_ptr__;
}

Assistant:

std::string RGBIlluminantSpectrum::ToString() const {
    return StringPrintf("[ RGBIlluminantSpectrum: rsp: %s scale: %f illuminant: %s ]",
                        rsp, scale, *illuminant);
}